

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

iterator * __thiscall ghc::filesystem::path::iterator::operator++(iterator *this)

{
  bool bVar1;
  reference pcVar2;
  bool local_29;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  char *local_18;
  iterator *local_10;
  iterator *this_local;
  
  local_10 = this;
  local_18 = (char *)increment(this,&this->_iter);
  (this->_iter)._M_current = local_18;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&this->_iter,&this->_last);
    local_29 = false;
    if (bVar1) {
      bVar1 = __gnu_cxx::operator!=(&this->_iter,&this->_root);
      local_29 = false;
      if (bVar1) {
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&this->_iter);
        local_29 = false;
        if (*pcVar2 == '/') {
          local_20 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(&this->_iter,1);
          local_29 = __gnu_cxx::operator!=(&local_20,&this->_last);
        }
      }
    }
    if (local_29 == false) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&this->_iter);
  }
  updateCurrent(this);
  return this;
}

Assistant:

GHC_INLINE path::iterator& path::iterator::operator++()
{
    _iter = increment(_iter);
    while (_iter != _last &&                // we didn't reach the end
           _iter != _root &&                // this is not a root position
           *_iter == preferred_separator &&  // we are on a separator
           (_iter + 1) != _last             // the slash is not the last char
    ) {
        ++_iter;
    }
    updateCurrent();
    return *this;
}